

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Enumerant::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  bool bVar1;
  ElementCount index;
  bool bVar2;
  ArrayPtr<const_char> AVar3;
  undefined1 local_e8 [16];
  WirePointer *local_d8;
  int local_d0;
  WirePointer *local_c8;
  short local_bc;
  int local_b8;
  StructReader local_b0;
  ListReader local_80;
  PointerReader local_50;
  
  if (proto._reader.pointerCount < 2) {
    local_d0 = 0x7fffffff;
    local_e8._8_8_ = (SegmentReader *)0x0;
    local_d8 = (WirePointer *)0x0;
    local_e8._0_8_ = (SegmentReader *)0x0;
  }
  else {
    local_d8 = proto._reader.pointers + 1;
    local_e8._8_8_ = proto._reader.capTable;
    local_e8._0_8_ = proto._reader.segment;
    local_d0 = proto._reader.nestingLimit;
  }
  index = 0;
  _::PointerReader::getList(&local_80,(PointerReader *)local_e8,INLINE_COMPOSITE,(word *)0x0);
  if (local_80.elementCount != 0) {
    bVar2 = false;
    do {
      _::ListReader::getStructElement(&local_b0,&local_80,index);
      if ((0x3f < local_b0.dataSize) && (*local_b0.data == -0xd9b5886010e6e32)) {
        if (local_b0.pointerCount == 0) {
          local_b0.nestingLimit = 0x7fffffff;
          local_b0.capTable = (CapTableReader *)0x0;
          local_b0.pointers = (WirePointer *)0x0;
          local_b0.segment = (SegmentReader *)0x0;
        }
        local_50.segment = local_b0.segment;
        local_50.capTable = local_b0.capTable;
        local_50.pointer = local_b0.pointers;
        local_50.nestingLimit = local_b0.nestingLimit;
        _::PointerReader::getStruct((StructReader *)(local_e8 + 8),&local_50,(word *)0x0);
        bVar1 = true;
        if (!bVar2) goto LAB_0017c434;
        break;
      }
      index = index + 1;
      bVar2 = local_80.elementCount == index;
    } while (!bVar2);
  }
  bVar1 = false;
LAB_0017c434:
  if (bVar1) {
    local_e8._0_8_ = local_e8._8_8_;
    local_e8._8_8_ = local_d8;
    local_d8 = local_c8;
    local_d0 = local_b8;
    if (local_bc == 0) {
      local_d0 = 0x7fffffff;
      local_e8._8_8_ = (WirePointer *)0x0;
      local_d8 = (WirePointer *)0x0;
      local_e8._0_8_ = (SegmentReader *)0x0;
    }
  }
  else {
    local_e8._0_8_ = proto._reader.segment;
    local_e8._8_8_ = proto._reader.capTable;
    local_d8 = proto._reader.pointers;
    local_d0 = proto._reader.nestingLimit;
    if (proto._reader.pointerCount == 0) {
      local_d0 = 0x7fffffff;
      local_e8._8_8_ = (WirePointer *)0x0;
      local_d8 = (WirePointer *)0x0;
      local_e8._0_8_ = (SegmentReader *)0x0;
    }
  }
  AVar3 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)local_e8,(void *)0x0,0);
  return (StringPtr)AVar3;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_MAYBE(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name->getText();
    } else {
      return proto.getName();
    }
  }